

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitles.cpp
# Opt level: O2

long __thiscall
text_subtitles::TextToPGSConverter::composeEnd
          (TextToPGSConverter *this,uint8_t *buff,int64_t pts,int64_t dts,bool needPgHeader)

{
  undefined3 in_register_00000081;
  uint8_t *puVar1;
  
  puVar1 = buff;
  if (CONCAT31(in_register_00000081,needPgHeader) != 0) {
    writePGHeader(buff,pts,dts);
    puVar1 = buff + 10;
  }
  *puVar1 = 0x80;
  AV_WB16(puVar1 + 1,0);
  return (long)(puVar1 + (3 - (long)buff));
}

Assistant:

long TextToPGSConverter::composeEnd(uint8_t* buff, const int64_t pts, const int64_t dts, const bool needPgHeader)
{
    uint8_t* curPos = buff;
    if (needPgHeader)
        curPos += writePGHeader(curPos, pts, dts);
    *curPos++ = END_DEF_SEGMENT;
    curPos += 2;  // skip length field
    uint8_t* startPos = curPos;
    AV_WB16(startPos - 2, static_cast<uint16_t>(curPos - startPos));
    return static_cast<long>(curPos - buff);
}